

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccallback.c
# Opt level: O0

void lj_ccallback_leave(CTState *cts,TValue *o)

{
  lua_State *L_00;
  TValue *pTVar1;
  long lVar2;
  ulong uVar3;
  GCproto *pt;
  TValue *obase;
  GCfunc *fn;
  lua_State *L;
  TValue *o_local;
  CTState *cts_local;
  
  L_00 = cts->L;
  pTVar1 = L_00->base;
  L_00->base = L_00->top;
  if ((L_00->base <= o) &&
     (uVar3 = L_00->base[-2].u64 & 0x7fffffffffff, *(char *)(uVar3 + 10) == '\0')) {
    lVar2 = *(long *)(uVar3 + 0x20);
    *(ulong *)((long)L_00->cframe + 0x18) = lVar2 + (ulong)*(uint *)(lVar2 + -0x5c) * 4 + 4;
  }
  callback_conv_result(cts,L_00,o);
  L_00->top = L_00->top + -4;
  L_00->base = pTVar1;
  L_00->cframe = *(void **)((long)L_00->cframe + 0x20);
  (cts->cb).slot = 0;
  return;
}

Assistant:

void LJ_FASTCALL lj_ccallback_leave(CTState *cts, TValue *o)
{
  lua_State *L = cts->L;
  GCfunc *fn;
  TValue *obase = L->base;
  L->base = L->top;  /* Keep continuation frame for throwing errors. */
  if (o >= L->base) {
    /* PC of RET* is lost. Point to last line for result conv. errors. */
    fn = curr_func(L);
    if (isluafunc(fn)) {
      GCproto *pt = funcproto(fn);
      setcframe_pc(L->cframe, proto_bc(pt)+pt->sizebc+1);
    }
  }
  callback_conv_result(cts, L, o);
  /* Finally drop C frame and continuation frame. */
  L->top -= 2+2*LJ_FR2;
  L->base = obase;
  L->cframe = cframe_prev(L->cframe);
  cts->cb.slot = 0;  /* Blacklist C function that called the callback. */
}